

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O2

int asn1_time_to_tm(tm *tm,ASN1_TIME *t,int allow_timezone_offset)

{
  uint uVar1;
  int iVar2;
  time_t time;
  
  if (t == (ASN1_TIME *)0x0) {
    time = ::time((time_t *)0x0);
    iVar2 = OPENSSL_posix_to_tm(time,tm);
    uVar1 = (uint)(iVar2 != 0);
  }
  else {
    if (t->type == 0x18) {
      iVar2 = asn1_generalizedtime_to_tm(tm,t);
      return iVar2;
    }
    uVar1 = 0;
    if (t->type == 0x17) {
      iVar2 = asn1_utctime_to_tm(tm,t,allow_timezone_offset);
      return iVar2;
    }
  }
  return uVar1;
}

Assistant:

static int asn1_time_to_tm(struct tm *tm, const ASN1_TIME *t,
                           int allow_timezone_offset) {
  if (t == NULL) {
    if (OPENSSL_posix_to_tm(time(NULL), tm)) {
      return 1;
    }
    return 0;
  }

  if (t->type == V_ASN1_UTCTIME) {
    return asn1_utctime_to_tm(tm, t, allow_timezone_offset);
  } else if (t->type == V_ASN1_GENERALIZEDTIME) {
    return asn1_generalizedtime_to_tm(tm, t);
  }

  return 0;
}